

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O1

void Abc_NodeSetTravIdCurrent(Abc_Obj_t *p)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  int in_EDX;
  
  pAVar3 = p->pNtk;
  iVar1 = pAVar3->nTravIds;
  iVar2 = p->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar2 + 1,in_EDX);
  if ((-1 < (long)iVar2) && (iVar2 < (pAVar3->vTravIds).nSize)) {
    (pAVar3->vTravIds).pArray[iVar2] = iVar1;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

static inline void        Abc_NodeSetTravIdCurrent( Abc_Obj_t * p )         { Abc_NodeSetTravId( p, Abc_ObjNtk(p)->nTravIds );                                      }